

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryStoreTestCase.cpp
# Opt level: O0

void __thiscall memoryStoreFixture::memoryStoreFixture(memoryStoreFixture *this,bool reset)

{
  string *beginString;
  string *senderCompID;
  string *targetCompID;
  MessageStore *pMVar1;
  UtcTimeStamp local_358;
  exception *e;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  STRING local_2f0;
  StringField local_2d0;
  allocator<char> local_271;
  STRING local_270;
  StringField local_250;
  allocator<char> local_1e1;
  STRING local_1e0;
  StringField local_1c0;
  undefined1 local_168 [8];
  SessionID sessionID;
  bool reset_local;
  memoryStoreFixture *this_local;
  
  sessionID.m_frozenString.field_2._M_local_buf[0xf] = reset;
  FIX::MemoryStoreFactory::MemoryStoreFactory(&this->factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"FIX.4.2",&local_1e1);
  FIX::BeginString::BeginString((BeginString *)&local_1c0,&local_1e0);
  beginString = FIX::StringField::operator_cast_to_string_(&local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"SETGET",&local_271);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_250,&local_270);
  senderCompID = FIX::StringField::operator_cast_to_string_(&local_250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"TEST",&local_2f1);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_2d0,&local_2f0);
  targetCompID = FIX::StringField::operator_cast_to_string_(&local_2d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"",&local_319);
  FIX::SessionID::SessionID((SessionID *)local_168,beginString,senderCompID,targetCompID,&local_318)
  ;
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  FIX::TargetCompID::~TargetCompID((TargetCompID *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  FIX::BeginString::~BeginString((BeginString *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  FIX::UtcTimeStamp::now();
  pMVar1 = (MessageStore *)FIX::MemoryStoreFactory::create((UtcTimeStamp *)this,(SessionID *)&e);
  this->object = pMVar1;
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&e);
  if ((sessionID.m_frozenString.field_2._M_local_buf[0xf] & 1U) != 0) {
    pMVar1 = this->object;
    FIX::UtcTimeStamp::now();
    (*pMVar1->_vptr_MessageStore[0xb])(pMVar1,&local_358);
    FIX::UtcTimeStamp::~UtcTimeStamp(&local_358);
  }
  this->resetAfter = (bool)(sessionID.m_frozenString.field_2._M_local_buf[0xf] & 1);
  FIX::SessionID::~SessionID((SessionID *)local_168);
  return;
}

Assistant:

memoryStoreFixture(bool reset) {
    SessionID sessionID(BeginString("FIX.4.2"), SenderCompID("SETGET"), TargetCompID("TEST"));

    try {
      object = factory.create(UtcTimeStamp::now(), sessionID);
    } catch (std::exception &e) {
      std::cerr << e.what() << std::endl;
      throw;
    }

    if (reset) {
      object->reset(UtcTimeStamp::now());
    }

    this->resetAfter = reset;
  }